

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglconvenience.cpp
# Opt level: O0

void __thiscall QEglConfigChooser::QEglConfigChooser(QEglConfigChooser *this,EGLDisplay display)

{
  QSurfaceFormat *in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__QEglConfigChooser_00e21548;
  QSurfaceFormat::QSurfaceFormat(in_RSI);
  in_RDI[2] = in_RSI;
  *(undefined4 *)(in_RDI + 3) = 4;
  *(undefined1 *)((long)in_RDI + 0x1c) = 0;
  *(undefined4 *)(in_RDI + 4) = 0;
  *(undefined4 *)((long)in_RDI + 0x24) = 0;
  *(undefined4 *)(in_RDI + 5) = 0;
  *(undefined4 *)((long)in_RDI + 0x2c) = 0;
  return;
}

Assistant:

QEglConfigChooser::QEglConfigChooser(EGLDisplay display)
    : m_display(display)
    , m_surfaceType(EGL_WINDOW_BIT)
    , m_ignore(false)
    , m_confAttrRed(0)
    , m_confAttrGreen(0)
    , m_confAttrBlue(0)
    , m_confAttrAlpha(0)
{
}